

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

UnknownFieldSet * google::protobuf::UnknownFieldSet::default_instance(void)

{
  int iVar1;
  UnknownFieldSet *in_stack_ffffffffffffffe0;
  
  if (default_instance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&default_instance()::instance);
    if (iVar1 != 0) {
      operator_new(0x18);
      UnknownFieldSet((UnknownFieldSet *)0x469219);
      default_instance::instance =
           internal::OnShutdownDelete<google::protobuf::UnknownFieldSet>(in_stack_ffffffffffffffe0);
      __cxa_guard_release(&default_instance()::instance);
    }
  }
  return default_instance::instance;
}

Assistant:

const UnknownFieldSet* UnknownFieldSet::default_instance() {
  static auto instance = internal::OnShutdownDelete(new UnknownFieldSet());
  return instance;
}